

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBExtractAlphaRow_C(uint8_t *src_argb,uint8_t *dst_a,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    dst_a[lVar1] = src_argb[lVar1 * 4 + 3];
    dst_a[lVar1 + 1] = src_argb[lVar1 * 4 + 7];
  }
  if ((width & 1U) != 0) {
    dst_a[lVar1] = src_argb[lVar1 * 4 + 3];
  }
  return;
}

Assistant:

void ARGBExtractAlphaRow_C(const uint8_t* src_argb, uint8_t* dst_a, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst_a[0] = src_argb[3];
    dst_a[1] = src_argb[7];
    dst_a += 2;
    src_argb += 8;
  }
  if (width & 1) {
    dst_a[0] = src_argb[3];
  }
}